

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

string_view slang::ast::SemanticFacts::getProcedureKindStr(ProceduralBlockKind kind)

{
  string_view sVar1;
  
  sVar1 = (string_view)(*(code *)(&DAT_00405bb4 + *(int *)(&DAT_00405bb4 + (ulong)kind * 4)))();
  return sVar1;
}

Assistant:

std::string_view SemanticFacts::getProcedureKindStr(ProceduralBlockKind kind) {
    switch (kind) {
        case ProceduralBlockKind::Initial:
            return "initial"sv;
        case ProceduralBlockKind::Final:
            return "final"sv;
        case ProceduralBlockKind::Always:
            return "always"sv;
        case ProceduralBlockKind::AlwaysComb:
            return "always_comb"sv;
        case ProceduralBlockKind::AlwaysLatch:
            return "always_latch"sv;
        case ProceduralBlockKind::AlwaysFF:
            return "always_ff"sv;
    }
    SLANG_UNREACHABLE;
}